

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::error(JSONReactor *this,qpdf_offset_t offset,string *msg)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 local_40 [8];
  string object;
  string *msg_local;
  qpdf_offset_t offset_local;
  JSONReactor *this_local;
  
  this->errors = true;
  object.field_2._8_8_ = msg;
  std::__cxx11::string::string((string *)local_40,(string *)&this->cur_object);
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->is);
  iVar2 = (*peVar3->_vptr_InputSource[3])();
  getFilename_abi_cxx11_(&local_70,this->pdf);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->is);
    iVar2 = (*peVar3->_vptr_InputSource[3])();
    std::operator+(&local_90," from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  warn(this->pdf,qpdf_e_json,(string *)local_40,offset,(string *)object.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
QPDF::JSONReactor::error(qpdf_offset_t offset, std::string const& msg)
{
    errors = true;
    std::string object = this->cur_object;
    if (is->getName() != pdf.getFilename()) {
        object += " from " + is->getName();
    }
    pdf.warn(qpdf_e_json, object, offset, msg);
}